

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

void __thiscall
dlib::
matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
::matrix(matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         *this,matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *m)

{
  (this->data).nc_ = 0;
  (this->data).data = (rgb_pixel *)0x0;
  (this->data).nr_ = 0;
  (this->data).pool._vptr_memory_manager_stateless_kernel_1 =
       (_func_int **)&PTR__memory_manager_stateless_kernel_1_001fa458;
  row_major_layout::
  layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::set_size
            (&this->data,(m->data).nr_,(m->data).nc_);
  matrix_assign_default<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_exp<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
            (this,(matrix_exp<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                   *)m);
  return;
}

Assistant:

matrix (
            const matrix& m
        ) : matrix_exp<matrix>(*this) 
        {
            data.set_size(m.nr(),m.nc());
            matrix_assign(*this, m);
        }